

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O1

gc_heap_ptr<mjs::number_object> __thiscall
mjs::gc_heap::
allocate_and_construct<mjs::number_object,mjs::string,mjs::gc_heap_ptr<mjs::object>,double>
          (gc_heap *this,size_t num_bytes,string *args,gc_heap_ptr<mjs::object> *args_1,
          double *args_2)

{
  slot sVar1;
  slot *this_00;
  undefined8 extraout_RDX;
  slot *in_R9;
  allocation_result aVar2;
  gc_heap_ptr<mjs::number_object> gVar3;
  
  aVar2 = allocation_context::allocate((allocation_context *)(num_bytes + 0x10),(size_t)args);
  this_00 = aVar2.obj;
  if (*(int *)((long)this_00 + -4) == -1) {
    sVar1 = *in_R9;
    object::object((object *)&this_00->allocation,(string *)args_1,(object_ptr *)args_2);
    this_00->representation = (uint64_t)&PTR_get_001d28a8;
    this_00[4] = sVar1;
    *(undefined4 *)((long)this_00 + -4) = gc_type_info_registration<mjs::number_object>::reg._40_4_;
    (this->pointers_).set_ = (gc_heap_ptr_untyped **)num_bytes;
    (this->pointers_).capacity_ = aVar2.pos;
    attach((gc_heap *)num_bytes,(gc_heap_ptr_untyped *)this);
    gVar3.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar3.super_gc_heap_ptr_untyped.heap_ = this;
    return (gc_heap_ptr<mjs::number_object>)gVar3.super_gc_heap_ptr_untyped;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::number_object, Args = <mjs::string, mjs::gc_heap_ptr<mjs::object>, double>]"
               );
}

Assistant:

gc_heap_ptr<T> gc_heap::allocate_and_construct(size_t num_bytes, Args&&... args) {
    auto a = alloc_context_.allocate(num_bytes);
    assert(a.hdr().type == uninitialized_type_index);
    gc_type_info_registration<T>::construct(a.obj, std::forward<Args>(args)...);
    a.hdr().type = gc_type_info_registration<T>::index();
    return gc_heap_ptr<T>{*this, a.pos};
}